

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_approximate_table_::run
          (Test_intlog_log10floor_approximate_table_ *this)

{
  string_view msg;
  SourceLocation loc;
  long *plVar1;
  long *plVar2;
  unsigned_long *puVar3;
  long *plVar4;
  Table<unsigned_char,_64UL> table;
  size_t in_stack_fffffffffffffec0;
  long local_128;
  long lStack_120;
  uint64_t local_118;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 uVar7;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Table<unsigned_char,_64UL> local_58;
  
  builtin_memcpy(local_58.data + 0x30,
                 "\x0e\x0e\x0f\x0f\x0f\x0f\x10\x10\x10\x11\x11\x11\x12\x12\x12\x12",0x10);
  builtin_memcpy(local_58.data + 0x20,"\t\t\n\n\n\v\v\v\f\f\f\f\r\r\r\x0e",0x10);
  builtin_memcpy(local_58.data + 0x10,"\x04\x05\x05\x05\x06\x06\x06\x06\a\a\a\b\b\b\t\t",0x10);
  local_58.data[0] = '\0';
  local_58.data[1] = '\0';
  local_58.data[2] = '\0';
  local_58.data[3] = '\0';
  local_58.data[4] = '\x01';
  local_58.data[5] = '\x01';
  local_58.data[6] = '\x01';
  local_58.data[7] = '\x02';
  local_58.data[8] = '\x02';
  local_58.data[9] = '\x02';
  local_58.data[10] = '\x03';
  local_58.data[0xb] = '\x03';
  local_58.data[0xc] = '\x03';
  local_58.data[0xd] = '\x03';
  local_58.data[0xe] = '\x04';
  local_58.data[0xf] = '\x04';
  local_118 = detail::approximateGuessTable<64ul>(&local_58);
  if (local_118 != 0xffffffffffffffff) {
    return;
  }
  detail::stringify_impl<unsigned_long>(&local_b8,&local_118);
  std::operator+(&local_98,
                 "Comparison failed: detail::approximateGuessTable(table) != detail::NO_APPROXIMATION (with \"detail::approximateGuessTable(table)\"="
                 ,&local_b8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  _Var5._M_p = (pointer)*plVar1;
  puVar3 = (unsigned_long *)(plVar1 + 2);
  if ((unsigned_long *)_Var5._M_p == puVar3) {
    uVar7 = *puVar3;
    _Var5._M_p = &stack0xffffffffffffff00;
  }
  else {
    uVar7 = *puVar3;
  }
  sVar6 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  detail::stringify_impl<unsigned_long>(&local_d8,&detail::NO_APPROXIMATION);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffef0,&local_d8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar1 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (plVar1 == plVar4) {
    local_128 = *plVar4;
    lStack_120 = plVar2[3];
    plVar1 = &local_128;
  }
  else {
    local_128 = *plVar4;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  msg._M_str = (char *)plVar1;
  msg._M_len = in_stack_fffffffffffffec0;
  loc.function = (char *)sVar6;
  loc.file = _Var5._M_p;
  loc.line = uVar7;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(intlog, log10floor_approximate_table)
{
    auto table = detail::makeGuessTable<std::uint64_t, 10>();
    BITMANIP_ASSERT_NE(detail::approximateGuessTable(table), detail::NO_APPROXIMATION);
}